

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_resume(HSQUIRRELVM v,SQBool retval,SQBool raiseerror)

{
  bool bVar1;
  SQObjectPtr *pSVar2;
  long in_RSI;
  SQBool in_stack_000003b8;
  SQObjectPtr *in_stack_000003c0;
  SQInteger in_stack_000003c8;
  SQInteger in_stack_000003d0;
  SQObjectPtr *in_stack_000003d8;
  SQVM *in_stack_000003e0;
  ExecutionType in_stack_00000400;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffbc;
  SQVM *in_stack_ffffffffffffffc0;
  SQRESULT local_8;
  
  pSVar2 = SQVM::GetUp(in_stack_ffffffffffffffc0,
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if ((pSVar2->super_SQObject)._type == OT_GENERATOR) {
    SQVM::PushNull((SQVM *)0x1118fa);
    SQVM::GetUp(in_stack_ffffffffffffffc0,
                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    SQVM::GetUp(in_stack_ffffffffffffffc0,
                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    uVar3 = 1;
    bVar1 = SQVM::Execute(in_stack_000003e0,in_stack_000003d8,in_stack_000003d0,in_stack_000003c8,
                          in_stack_000003c0,in_stack_000003b8,in_stack_00000400);
    if (bVar1) {
      if (in_RSI == 0) {
        SQVM::Pop((SQVM *)0x111994);
      }
      local_8 = 0;
    }
    else {
      SQVM::Raise_Error(in_stack_ffffffffffffffc0,
                        (SQObjectPtr *)CONCAT44(in_stack_ffffffffffffffbc,uVar3));
      local_8 = -1;
    }
  }
  else {
    local_8 = sq_throwerror(in_stack_ffffffffffffffc0,
                            (SQChar *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
    ;
  }
  return local_8;
}

Assistant:

SQRESULT sq_resume(HSQUIRRELVM v,SQBool retval,SQBool raiseerror)
{
    if (sq_type(v->GetUp(-1)) == OT_GENERATOR)
    {
        v->PushNull(); //retval
        if (!v->Execute(v->GetUp(-2), 0, v->_top, v->GetUp(-1), raiseerror, SQVM::ET_RESUME_GENERATOR))
        {v->Raise_Error(v->_lasterror); return SQ_ERROR;}
        if(!retval)
            v->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("only generators can be resumed"));
}